

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall QtMWidgets::MessageBox::_q_clicked(MessageBox *this)

{
  QObject *object;
  QAbstractButton *pQVar1;
  MessageBoxPrivate *pMVar2;
  MessageBoxPrivate *pMVar3;
  ButtonRole *pBVar4;
  QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
  *this_00;
  ButtonRole role;
  MessageBox *this_local;
  
  object = (QObject *)QObject::sender();
  pQVar1 = qobject_cast<QAbstractButton*>(object);
  this_00 = &this->d;
  pMVar2 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
           ::operator->(this_00);
  pMVar2->clickedButton = pQVar1;
  pMVar2 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
           ::operator->(this_00);
  pMVar3 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
           ::operator->(this_00);
  pBVar4 = QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::operator[]
                     (&pMVar2->buttonsMap,&pMVar3->clickedButton);
  if (*pBVar4 == AcceptRole) {
    (**(code **)(*(long *)this + 0x1b8))();
  }
  else if (*pBVar4 == RejectRole) {
    (**(code **)(*(long *)this + 0x1c0))();
  }
  pMVar2 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
           ::operator->(&this->d);
  buttonClicked(this,pMVar2->clickedButton);
  return;
}

Assistant:

void
MessageBox::_q_clicked()
{
	d->clickedButton = qobject_cast< QAbstractButton* > ( sender() );

	ButtonRole role = d->buttonsMap[ d->clickedButton ];

	switch( role )
	{
		case AcceptRole :
			accept();
			break;

		case RejectRole :
			reject();
			break;

		default :
			break;
	}

	emit buttonClicked( d->clickedButton );
}